

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_parser_test.cpp
# Opt level: O3

void __thiscall bioparser::test::BioparserSamTest::Check(BioparserSamTest *this)

{
  SamOverlap *pSVar1;
  undefined8 *puVar2;
  long lVar3;
  pointer puVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  undefined8 *local_18;
  
  local_28.data_._0_4_ = 0x30;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->o).
              super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_20,"48","o.size()",(int *)&local_28,(unsigned_long *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/sam_parser_test.cpp"
               ,0x3f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  puVar2 = local_18;
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(puVar2);
  }
  local_30._M_head_impl._0_4_ = 0xc2265;
  lVar3 = 0;
  for (puVar4 = (this->o).
                super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 != (this->o).
                super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    pSVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
             ._M_t.
             super__Tuple_impl<0UL,_bioparser::test::SamOverlap_*,_std::default_delete<bioparser::test::SamOverlap>_>
             .super__Head_base<0UL,_bioparser::test::SamOverlap_*,_false>._M_head_impl;
    lVar3 = lVar3 + (pSVar1->q_name)._M_string_length + (pSVar1->t_name)._M_string_length +
            *(size_type *)((long)&(pSVar1->super_Overlap).alignment + 8) +
            (pSVar1->t_next_name)._M_string_length + (pSVar1->data)._M_string_length +
            (pSVar1->quality)._M_string_length;
  }
  local_28.data_._0_4_ = (int)lVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_20,"795237",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<SamOverlap>& it) { return s + it->q_name.size() + it->t_name.size() + it->alignment.size() + it->t_next_name.size() + it->data.size() + it->quality.size(); })"
             ,(int *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/sam_parser_test.cpp"
               ,0x49,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  puVar2 = local_18;
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(puVar2);
  }
  local_30._M_head_impl._0_4_ = 0x9c2bd;
  local_28.data_._0_4_ = 0;
  for (puVar4 = (this->o).
                super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar4 != (this->o).
                super__Vector_base<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
    pSVar1 = (puVar4->_M_t).
             super___uniq_ptr_impl<bioparser::test::SamOverlap,_std::default_delete<bioparser::test::SamOverlap>_>
             ._M_t.
             super__Tuple_impl<0UL,_bioparser::test::SamOverlap_*,_std::default_delete<bioparser::test::SamOverlap>_>
             .super__Head_base<0UL,_bioparser::test::SamOverlap_*,_false>._M_head_impl;
    local_28.data_._0_4_ =
         (int)local_28.data_ + pSVar1->flag + (pSVar1->super_Overlap).rhs_begin +
         pSVar1->map_quality + pSVar1->t_next_begin + pSVar1->template_len;
  }
  testing::internal::CmpHelperEQ<int,int>
            (local_20,"639677",
             "std::accumulate(o.begin(), o.end(), 0, [] (std::uint32_t s, const std::unique_ptr<SamOverlap>& it) { return s + it->flag + it->rhs_begin + it->map_quality + it->t_next_begin + it->template_len; })"
             ,(int *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/sam_parser_test.cpp"
               ,0x52,pcVar5);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

void Check() {
    EXPECT_EQ(48, o.size());
    EXPECT_EQ(795237, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<SamOverlap>& it) {
          return s +
              it->q_name.size() +
              it->t_name.size() +
              it->alignment.size() +
              it->t_next_name.size() +
              it->data.size() +
              it->quality.size();
        }));
    EXPECT_EQ(639677, std::accumulate(o.begin(), o.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<SamOverlap>& it) {
          return s +
              it->flag +
              it->rhs_begin +
              it->map_quality +
              it->t_next_begin +
              it->template_len;
        }));
  }